

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,1024u>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *node,uchar **dst
                   ,size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  uint uVar1;
  vector_block<unsigned_char_*,_1024U> *this;
  pointer pppuVar2;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *node_00;
  size_t __n;
  uchar **__dest;
  pointer ppvVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  ppvVar3 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar3) {
    uVar5 = 0;
    do {
      if (((ulong)ppvVar3[uVar5] & 1) == 0) {
        this = (vector_block<unsigned_char_*,_1024U> *)ppvVar3[uVar5];
        if (this != (vector_block<unsigned_char_*,_1024U> *)0x0) {
          pppuVar2 = (this->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_start;
          small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                       (this->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          lVar6 = (long)small_sort - (long)pppuVar2;
          if ((pointer)small_sort == pppuVar2) {
            __assert_fail("not v._index_block.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                          ,0x5b,
                          "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                         );
          }
          uVar1 = this->_left_in_block;
          __dest = dst;
          if (8 < (ulong)((long)small_sort - (long)pppuVar2)) {
            uVar4 = 1;
            do {
              memmove(__dest,pppuVar2[uVar4 - 1],0x2000);
              __dest = __dest + 0x400;
              uVar4 = uVar4 + 1;
              pppuVar2 = (this->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                           (this->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
            } while (uVar4 < (ulong)((long)small_sort - (long)pppuVar2 >> 3));
          }
          __n = (long)this->_insertpos - (long)*(pointer)((long)small_sort + -8);
          if (__n != 0) {
            memmove(__dest,*(pointer)((long)small_sort + -8),__n);
          }
          lVar6 = lVar6 * 0x80 - (ulong)uVar1;
          if ((char)uVar5 != '\0') {
            mkqsort(dst,(int)lVar6,(int)depth);
          }
          dst = dst + lVar6;
          vector_block<unsigned_char_*,_1024U>::~vector_block(this);
          operator_delete(this);
        }
      }
      else {
        node_00 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_node
                            (node,(uint)uVar5);
        dst = traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,1024u>,unsigned_char>
                        (node_00,dst,depth + 1,small_sort);
      }
      uVar5 = (ulong)((uint)uVar5 + 1);
      ppvVar3 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(node->_buckets).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3));
  }
  if (ppvVar3 != (pointer)0x0) {
    operator_delete(ppvVar3);
  }
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}